

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O2

MempoolAcceptResult *
MempoolAcceptResult::Failure(MempoolAcceptResult *__return_storage_ptr__,TxValidationState state)

{
  long lVar1;
  ValidationState<TxValidationResult> *in_RSI;
  long in_FS_OFFSET;
  ValidationState<TxValidationResult> in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ValidationState<TxValidationResult>::ValidationState
            ((ValidationState<TxValidationResult> *)&stack0xffffffffffffffa0,in_RSI);
  MempoolAcceptResult(__return_storage_ptr__,(TxValidationState)in_stack_ffffffffffffff98);
  ValidationState<TxValidationResult>::~ValidationState
            ((ValidationState<TxValidationResult> *)&stack0xffffffffffffffa0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static MempoolAcceptResult Failure(TxValidationState state) {
        return MempoolAcceptResult(state);
    }